

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *
google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>::
GetRepeated(int number,ExtensionSet *set)

{
  RepeatedFieldType *default_value;
  RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *pRVar1;
  ExtensionSet *set_local;
  int number_local;
  
  default_value = GetDefaultRepeatedField();
  pRVar1 = (RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *)
           ExtensionSet::GetRawRepeatedField(set,number,default_value);
  return pRVar1;
}

Assistant:

static inline const RepeatedPtrField<Type>& GetRepeated(
      int number, const ExtensionSet& set) {
    // See notes above in RepeatedEnumTypeTraits::GetRepeated(): same
    // casting hack applies here, because a RepeatedPtrField<MessageLite>
    // cannot naturally become a RepeatedPtrType<Type> even though Type is
    // presumably a message. google::protobuf::Message goes through similar contortions
    // with a reinterpret_cast<>.
    return *reinterpret_cast<const RepeatedPtrField<Type>*>(
        set.GetRawRepeatedField(number, GetDefaultRepeatedField()));
  }